

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
parse_format_string<false,wchar_t,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *handler)

{
  internal *piVar1;
  ulong uVar2;
  internal *end;
  int iVar3;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *pfVar4;
  size_t sVar5;
  wchar_t wVar6;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_RAX;
  internal *piVar7;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *this_00;
  internal *piVar8;
  buffer<wchar_t> *c;
  internal *piVar9;
  bool bVar10;
  id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
  local_38;
  
  this_00 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
             *)format_str.size_;
  end = this + (long)format_str.data_ * 4;
  piVar8 = this;
  local_38.handler = in_RAX;
  do {
    if (piVar8 == end) {
      return;
    }
    piVar9 = piVar8;
    if (*(wchar_t *)piVar8 == L'{') {
LAB_001516a5:
      if (piVar8 != piVar9) {
        do {
          bVar10 = piVar8 != piVar9;
          piVar7 = piVar8;
          if (bVar10) {
            iVar3 = *(int *)piVar8;
            while (iVar3 != 0x7d) {
              piVar7 = piVar7 + 4;
              bVar10 = piVar7 != piVar9;
              if (piVar7 == piVar9) goto LAB_001516e0;
              iVar3 = *(int *)piVar7;
            }
            bVar10 = true;
          }
LAB_001516e0:
          if (bVar10) {
            piVar1 = piVar7 + 4;
            if ((piVar1 == piVar9) || (*(wchar_t *)piVar1 != L'}')) goto LAB_00151882;
            this = (internal *)this_00;
            format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            ::on_text(this_00,(wchar_t *)piVar8,(wchar_t *)piVar1);
            piVar8 = piVar7 + 8;
          }
          else {
            this = (internal *)this_00;
            format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
            ::on_text(this_00,(wchar_t *)piVar8,(wchar_t *)piVar9);
          }
        } while (bVar10);
      }
      piVar9 = piVar9 + 4;
      if (piVar9 == end) {
        error_handler::on_error((error_handler *)this,"invalid format string");
      }
      if ((char)*(int *)piVar9 == '}') {
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        ::on_arg_id(this_00);
        piVar8 = piVar9;
LAB_0015173f:
        piVar9 = piVar8;
        this = (internal *)this_00;
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        ::on_replacement_field(this_00,(wchar_t *)piVar9);
      }
      else if (*(int *)piVar9 == 0x7b) {
        pfVar4 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                  *)(this_00->context).out_.container;
        sVar5 = (pfVar4->parse_context).format_str_.size_;
        uVar2 = sVar5 + 1;
        if (*(ulong *)&(pfVar4->parse_context).next_arg_id_ < uVar2) {
          this = (internal *)pfVar4;
          (*(code *)**(undefined8 **)&pfVar4->field_0x0)(pfVar4,uVar2);
        }
        (pfVar4->parse_context).format_str_.size_ = uVar2;
        (pfVar4->parse_context).format_str_.data_[sVar5] = *(wchar_t *)piVar9;
        (this_00->context).out_.container = (buffer<wchar_t> *)pfVar4;
      }
      else {
        local_38.handler = this_00;
        piVar8 = (internal *)
                 parse_arg_id<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                           ((wchar_t *)piVar9,(wchar_t *)end,&local_38);
        if (piVar8 == end) {
          wVar6 = L'\0';
        }
        else {
          wVar6 = *(wchar_t *)piVar8;
        }
        if (wVar6 != L':') {
          if (wVar6 != L'}') {
            error_handler::on_error((error_handler *)piVar9,"missing \'}\' in format string");
          }
          goto LAB_0015173f;
        }
        this = (internal *)this_00;
        piVar9 = (internal *)
                 format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                 ::on_format_specs(this_00,(wchar_t *)(piVar8 + 4),(wchar_t *)end);
        if ((piVar9 == end) || (*(wchar_t *)piVar9 != L'}')) {
          error_handler::on_error((error_handler *)this,"unknown format specifier");
        }
      }
      piVar8 = piVar9 + 4;
      bVar10 = true;
    }
    else {
      piVar9 = piVar8 + 4;
      bVar10 = piVar9 != end;
      if ((bVar10) && (bVar10 = true, *(wchar_t *)piVar9 != L'{')) {
        piVar7 = piVar8 + 8;
        do {
          piVar9 = piVar7;
          bVar10 = piVar9 != end;
          if (piVar9 == end) break;
          piVar7 = piVar9 + 4;
        } while (*(wchar_t *)piVar9 != L'{');
      }
      piVar7 = piVar8;
      if (bVar10) goto LAB_001516a5;
      do {
        bVar10 = piVar7 != end;
        piVar9 = piVar7;
        if (bVar10) {
          wVar6 = *(wchar_t *)piVar7;
          while (wVar6 != L'}') {
            piVar9 = piVar9 + 4;
            bVar10 = piVar9 != end;
            if (piVar9 == end) goto LAB_001517cb;
            wVar6 = *(wchar_t *)piVar9;
          }
          bVar10 = true;
        }
LAB_001517cb:
        if (bVar10) {
          piVar1 = piVar9 + 4;
          if ((piVar1 == end) || (*(wchar_t *)piVar1 != L'}')) {
LAB_00151882:
            error_handler::on_error((error_handler *)this,"unmatched \'}\' in format string");
          }
          this = (internal *)this_00;
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar7,(wchar_t *)piVar1);
          piVar7 = piVar9 + 8;
        }
        else {
          this = (internal *)this_00;
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)piVar7,(wchar_t *)end);
        }
      } while (bVar10);
      bVar10 = false;
    }
    if (!bVar10) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct pfs_writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin + 1, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}